

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::StaleFileRemovalCommand::getShortDescription
          (StaleFileRemovalCommand *this,SmallVectorImpl<char> *result)

{
  ulong uVar1;
  bool bVar2;
  allocator local_69;
  string local_68;
  raw_svector_ostream local_48;
  SmallVectorImpl<char> *local_18;
  SmallVectorImpl<char> *result_local;
  StaleFileRemovalCommand *this_local;
  
  local_18 = result;
  result_local = (SmallVectorImpl<char> *)this;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_48,result);
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"Stale file removal",&local_69);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&this->description);
  }
  llvm::raw_ostream::operator<<((raw_ostream *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  llvm::raw_svector_ostream::~raw_svector_ostream(&local_48);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << (description.empty() ? "Stale file removal" : description);
  }